

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O3

void writeDeepTiled(DeepTiledOutputPart *out,DeepFrameBuffer *buf,
                   vector<double,_std::allocator<double>_> *perf)

{
  iterator __position;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  double local_28;
  
  Imf_3_4::DeepTiledOutputPart::setFrameBuffer((DeepFrameBuffer *)out);
  lVar3 = std::chrono::_V2::steady_clock::now();
  iVar5 = (int)out;
  iVar1 = Imf_3_4::DeepTiledOutputPart::numXTiles(iVar5);
  iVar2 = Imf_3_4::DeepTiledOutputPart::numYTiles(iVar5);
  Imf_3_4::DeepTiledOutputPart::writeTiles(iVar5,0,iVar1 + -1,0,iVar2 + -1,0);
  if (perf != (vector<double,_std::allocator<double>_> *)0x0) {
    lVar4 = std::chrono::_V2::steady_clock::now();
    local_28 = (double)(lVar4 - lVar3) / 1000000000.0;
    __position._M_current =
         (perf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
         ._M_finish;
    if (__position._M_current ==
        (perf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (perf,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      (perf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void
writeDeepTiled (
    DeepTiledOutputPart& out, DeepFrameBuffer& buf, vector<double>* perf)
{
    out.setFrameBuffer (buf);
    steady_clock::time_point startWrite = steady_clock::now ();
    out.writeTiles (0, out.numXTiles (0) - 1, 0, out.numYTiles (0) - 1, 0, 0);

    if (perf)
    {
        steady_clock::time_point endWrite = steady_clock::now ();
        perf->push_back (timing (startWrite, endWrite));
    }
}